

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_nodesel.cc
# Opt level: O1

RC __thiscall QL_NodeSel::GetNextRec(QL_NodeSel *this,RM_Record *rec)

{
  int iVar1;
  RC RVar2;
  char *in_RAX;
  char cVar3;
  RC unaff_EBX;
  char *pData;
  char *local_28;
  
  local_28 = in_RAX;
  do {
    iVar1 = (*this->prevNode->_vptr_QL_Node[2])(this->prevNode,rec);
    if (iVar1 != 0) {
      return iVar1;
    }
    RVar2 = RM_Record::GetData(rec,&local_28);
    if (RVar2 == 0) {
      RVar2 = QL_Node::CheckConditions(&this->super_QL_Node,local_28);
      cVar3 = (RVar2 == 0) * '\x03';
    }
    else {
      cVar3 = '\x01';
      unaff_EBX = RVar2;
    }
  } while (cVar3 == '\0');
  if (cVar3 == '\x03') {
    unaff_EBX = 0;
  }
  return unaff_EBX;
}

Assistant:

RC QL_NodeSel::GetNextRec(RM_Record &rec){
  RC rc = 0;
  while(true){
    if((rc = prevNode.GetNextRec(rec)))
      return (rc);

    char *pData;
    if((rc = rec.GetData(pData)))
      return (rc);

    RC cond = CheckConditions(pData);
    if(cond ==0)
      break;
  }

  return (0);
}